

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::atou<unsigned_long>(c4 *this,csubstr str,unsigned_long *v)

{
  code *pcVar1;
  byte bVar2;
  undefined1 uVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  ulong *puVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  basic_substring<const_char> local_30;
  
  puVar7 = (ulong *)str.len;
  pcVar8 = str.str;
  if (pcVar8 != (char *)0x0) {
    if (this == (c4 *)0x0) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
      handle_error(0x24bbea,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c6,"len > 0 && str != nullptr");
    }
    if (*this == (c4)0x30) {
      bVar10 = true;
      if (pcVar8 == (char *)0x1) {
        uVar6 = 0;
LAB_00237445:
        *puVar7 = uVar6;
        return bVar10;
      }
      bVar2 = (byte)this[1] & 0xdf;
      if (bVar2 == 0x42) {
        if (pcVar8 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_30,(char *)(this + 2),(size_t)(pcVar8 + -2));
          if ((local_30.len == 0) || (local_30.str == (char *)0x0)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar1 = (code *)swi(3);
              uVar3 = (*pcVar1)();
              return (bool)uVar3;
            }
            handle_error(0x24bbea,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x2cce,"!s.empty()");
          }
          *puVar7 = 0;
          sVar5 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 * 2;
            if (local_30.str[sVar5] != '0') {
              if (local_30.str[sVar5] != '1') {
                bVar10 = false;
                break;
              }
              uVar6 = uVar6 | 1;
            }
            sVar5 = sVar5 + 1;
          } while (local_30.len != sVar5);
          goto LAB_00237445;
        }
      }
      else if (bVar2 == 0x4f) {
        if (pcVar8 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_30,(char *)(this + 2),(size_t)(pcVar8 + -2));
          if ((local_30.len != 0) && (local_30.str != (char *)0x0)) {
            *puVar7 = 0;
            sVar5 = 0;
            uVar6 = 0;
            do {
              bVar10 = (local_30.str[sVar5] & 0xf8U) == 0x30;
              if (!bVar10) {
                return bVar10;
              }
              uVar6 = ((ulong)(byte)local_30.str[sVar5] + uVar6 * 8) - 0x30;
              *puVar7 = uVar6;
              sVar5 = sVar5 + 1;
            } while (local_30.len != sVar5);
            return bVar10;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar1 = (code *)swi(3);
            uVar3 = (*pcVar1)();
            return (bool)uVar3;
          }
          handle_error(0x24bbea,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2ceb,"!s.empty()");
        }
      }
      else {
        if (bVar2 != 0x58) {
          *puVar7 = 0;
          pcVar4 = (char *)0x0;
          uVar6 = 0;
          do {
            bVar10 = (byte)((char)this[(long)pcVar4] - 0x30U) < 10;
            if (!bVar10) {
              return bVar10;
            }
            uVar6 = ((ulong)(byte)this[(long)pcVar4] + uVar6 * 10) - 0x30;
            *puVar7 = uVar6;
            pcVar4 = pcVar4 + 1;
          } while (pcVar8 != pcVar4);
          return bVar10;
        }
        if (pcVar8 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_30,(char *)(this + 2),(size_t)(pcVar8 + -2));
          if ((local_30.len == 0) || (local_30.str == (char *)0x0)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar1 = (code *)swi(3);
              uVar3 = (*pcVar1)();
              return (bool)uVar3;
            }
            handle_error(0x24bbea,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x2cac,"!s.empty()");
          }
          *puVar7 = 0;
          sVar5 = 0;
          uVar6 = 0;
          while( true ) {
            bVar2 = local_30.str[sVar5];
            lVar9 = -0x30;
            if (((9 < (byte)(bVar2 - 0x30)) && (lVar9 = -0x57, 5 < (byte)(bVar2 + 0x9f))) &&
               (lVar9 = -0x37, 5 < (byte)(bVar2 + 0xbf))) break;
            uVar6 = uVar6 * 0x10 + lVar9 + (ulong)bVar2;
            *puVar7 = uVar6;
            sVar5 = sVar5 + 1;
            if (local_30.len == sVar5) {
              return true;
            }
          }
        }
      }
    }
    else if (*this != (c4)0x2d) {
      *puVar7 = 0;
      pcVar4 = (char *)0x0;
      uVar6 = 0;
      do {
        bVar10 = (byte)((char)this[(long)pcVar4] - 0x30U) < 10;
        if (!bVar10) {
          return bVar10;
        }
        uVar6 = ((ulong)(byte)this[(long)pcVar4] + uVar6 * 10) - 0x30;
        *puVar7 = uVar6;
        pcVar4 = pcVar4 + 1;
      } while (pcVar8 != pcVar4);
      return bVar10;
    }
  }
  return false;
}

Assistant:

bool atou(csubstr str, T * C4_RESTRICT v) noexcept
{
    C4_STATIC_ASSERT(std::is_integral<T>::value);

    if(C4_UNLIKELY(str.len == 0 || str.front() == '-'))
        return false;

    bool parsed_ok = true;
    if(str.str[0] != '0')
    {
        parsed_ok = read_dec(str, v);
    }
    else
    {
        if(str.len > 1)
        {
            const char pfx = str.str[1];
            if(pfx == 'x' || pfx == 'X')
                parsed_ok = str.len > 2 && read_hex(str.sub(2), v);
            else if(pfx == 'b' || pfx == 'B')
                parsed_ok = str.len > 2 && read_bin(str.sub(2), v);
            else if(pfx == 'o' || pfx == 'O')
                parsed_ok = str.len > 2 && read_oct(str.sub(2), v);
            else
                parsed_ok = read_dec(str, v);
        }
        else
        {
            *v = 0; // we know the first character is 0
        }
    }
    return parsed_ok;
}